

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.cpp
# Opt level: O3

Var Js::SCADeserializationEngine::Deserialize
              (StreamReader *reader,Var *transferableVars,size_t cTransferableVars)

{
  scaposition_t src;
  undefined1 local_80 [8];
  SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_> engine;
  StreamDeserializationCloner cloner;
  void *dst;
  uint32 version;
  
  DeserializationCloner<Js::StreamReader>::DeserializationCloner
            ((DeserializationCloner<Js::StreamReader> *)&engine.m_cTransferableVars,
             (reader->super_ScriptContextHolder).m_scriptContext,reader);
  StreamReader::Read<unsigned_int>(reader,(uint *)((long)&dst + 4));
  if (0x1ffffff < dst._4_4_) {
    ScriptContextHolder::ThrowSCANewVersion((ScriptContextHolder *)&engine.m_cTransferableVars);
  }
  src = StreamReader::GetPosition(reader);
  SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::SCAEngine
            ((SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_> *)
             local_80,(DeserializationCloner<Js::StreamReader> *)&engine.m_cTransferableVars,
             transferableVars,cTransferableVars);
  SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
            ((SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_> *)
             local_80,src,(void **)&cloner.m_bufferLength);
  if (cloner._32_8_ != 0) {
    return (Var)cloner._32_8_;
  }
  ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)&engine.m_cTransferableVars);
}

Assistant:

Var SCADeserializationEngine::Deserialize(StreamReader* reader, Var* transferableVars, size_t cTransferableVars)
    {
        ScriptContext* scriptContext = reader->GetScriptContext();
        StreamDeserializationCloner cloner(scriptContext, reader);

        // Read version
        uint32 version;
        reader->Read(&version);
        if (GetSCAMajor(version) > SCA_FORMAT_MAJOR)
        {
            cloner.ThrowSCANewVersion();
        }
        Var value = SCAEngine<scaposition_t, Var, StreamDeserializationCloner>::Clone(reader->GetPosition(), &cloner, transferableVars, cTransferableVars);
        if (!value)
        {
            cloner.ThrowSCADataCorrupt();
        }

        return value;
    }